

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

YY_BUFFER_STATE yy_create_buffer(FILE *file,int size)

{
  YY_BUFFER_STATE pyVar1;
  char *pcVar2;
  int in_ESI;
  YY_BUFFER_STATE b;
  undefined4 in_stack_00000008;
  
  pyVar1 = (YY_BUFFER_STATE)yyalloc(0x107f47);
  if (pyVar1 == (YY_BUFFER_STATE)0x0) {
    yy_fatal_error((char *)0x107f5e);
  }
  pyVar1->yy_buf_size = in_ESI;
  pcVar2 = (char *)yyalloc(0x107f7b);
  pyVar1->yy_ch_buf = pcVar2;
  if (pyVar1->yy_ch_buf == (char *)0x0) {
    yy_fatal_error((char *)0x107f9d);
  }
  pyVar1->yy_is_our_buffer = 1;
  yy_init_buffer((YY_BUFFER_STATE)file,(FILE *)CONCAT44(size,in_stack_00000008));
  return pyVar1;
}

Assistant:

YY_BUFFER_STATE yy_create_buffer  (FILE * file, int  size )
{
	YY_BUFFER_STATE b;
    
	b = (YY_BUFFER_STATE) yyalloc( sizeof( struct yy_buffer_state )  );
	if ( ! b )
		YY_FATAL_ERROR( "out of dynamic memory in yy_create_buffer()" );

	b->yy_buf_size = size;

	/* yy_ch_buf has to be 2 characters longer than the size given because
	 * we need to put in 2 end-of-buffer characters.
	 */
	b->yy_ch_buf = (char *) yyalloc( (yy_size_t) (b->yy_buf_size + 2)  );
	if ( ! b->yy_ch_buf )
		YY_FATAL_ERROR( "out of dynamic memory in yy_create_buffer()" );

	b->yy_is_our_buffer = 1;

	yy_init_buffer( b, file );

	return b;
}